

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O0

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::StackNode
          (StackNode *this,StackNode *parent_in,string *name_in,StackKind kind_in)

{
  StackKind kind_in_local;
  string *name_in_local;
  StackNode *parent_in_local;
  StackNode *this_local;
  
  this->parent = parent_in;
  std::__cxx11::string::string((string *)&this->name,(string *)name_in);
  this->kind = kind_in;
  std::
  set<KokkosTools::SpaceTimeStack::StackNode,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
  ::set(&this->children);
  this->total_runtime = 0.0;
  this->total_kokkos_runtime = 0.0;
  this->number_of_calls = 0;
  this->total_number_of_kernel_calls = 0;
  Now::Now(&this->start_time);
  return;
}

Assistant:

StackNode(StackNode* parent_in, std::string&& name_in, StackKind kind_in)
      : parent(parent_in),
        name(std::move(name_in)),
        kind(kind_in),
        total_runtime(0.),
        total_kokkos_runtime(0.),
        number_of_calls(0),
        total_number_of_kernel_calls(0) {}